

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * ot::commissioner::CommissionerApp::ValidatePSKd(Error *__return_storage_ptr__,string *aPSKd)

{
  string *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  size_type sVar3;
  bool bVar4;
  char *pcVar5;
  int iVar6;
  byte *pbVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar9;
  bool bVar10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  writer write;
  string local_e0;
  writer local_c0;
  ErrorCode local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  ulong local_90;
  undefined1 local_88 [16];
  char *local_78;
  size_t local_70;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_68;
  parse_func local_60 [1];
  code *local_58;
  code *pcStack_50;
  code *local_48;
  byte *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  sVar3 = aPSKd->_M_string_length;
  if (sVar3 - 6 < 0x1b) {
    if (sVar3 == 0) {
      return __return_storage_ptr__;
    }
    pbVar7 = (byte *)(aPSKd->_M_dataplus)._M_p;
    local_38 = pbVar7 + sVar3;
    do {
      bVar2 = *pbVar7;
      local_90 = (ulong)bVar2;
      if (((int)(char)bVar2 - 0x30U < 10) || (iVar6 = isupper((int)(char)bVar2), iVar6 != 0)) {
        bVar4 = false;
        bVar10 = true;
        if ((bVar2 - 0x49 < 0x12) && ((0x20141U >> (bVar2 - 0x49 & 0x1f) & 1) != 0)) {
          local_88._0_4_ = char_type;
          pcVar9 = "PSKd includes invalid uppercase characters: {}";
          local_88._8_8_ = "PSKd includes invalid uppercase characters: {}";
          local_78 = (char *)0x2e;
          local_70 = 0x100000000;
          local_c0.handler_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_88;
          local_60[0] = ::fmt::v10::detail::
                        parse_format_specs<char,fmt::v10::detail::compile_parse_context<char>>;
          local_68 = local_c0.handler_;
          do {
            if (pcVar9 == "") break;
            pcVar8 = pcVar9;
            if (*pcVar9 == '{') {
LAB_00162b60:
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char>_>
              ::writer::operator()((writer *)&local_c0,pcVar9,pcVar8);
              pcVar9 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char>&>
                                 (pcVar8,"",(format_string_checker<char> *)local_88);
              bVar10 = true;
            }
            else {
              pcVar8 = pcVar9 + 1;
              bVar10 = pcVar8 != "";
              if (bVar10) {
                if (*pcVar8 != '{') {
                  pcVar5 = pcVar9 + 2;
                  do {
                    pcVar8 = pcVar5;
                    bVar10 = pcVar8 != "";
                    if (pcVar8 == "") goto LAB_00162b5c;
                    pcVar5 = pcVar8 + 1;
                  } while (*pcVar8 != '{');
                }
                bVar10 = true;
              }
LAB_00162b5c:
              if (bVar10) goto LAB_00162b60;
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char>_>
              ::writer::operator()((writer *)&local_c0,pcVar9,"");
              bVar10 = false;
            }
          } while (bVar10);
          local_88._0_8_ = local_90;
          fmt.size_ = 8;
          fmt.data_ = (char *)0x2e;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)local_88;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_e0,(v10 *)"PSKd includes invalid uppercase characters: {}",fmt,args);
          local_b8 = kInvalidArgs;
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b0,local_e0._M_dataplus._M_p,
                     local_e0._M_dataplus._M_p + local_e0._M_string_length);
          __return_storage_ptr__->mCode = local_b8;
          std::__cxx11::string::operator=((string *)this,(string *)local_b0);
          if (local_b0[0] != local_a0) goto LAB_00162c11;
          goto LAB_00162c16;
        }
      }
      else {
        local_88._0_4_ = char_type;
        pcVar9 = "PSKd includes non-digit and non-uppercase characters: {}";
        local_88._8_8_ = "PSKd includes non-digit and non-uppercase characters: {}";
        local_78 = (char *)0x38;
        local_70 = 0x100000000;
        local_c0.handler_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_88;
        local_60[0] = ::fmt::v10::detail::
                      parse_format_specs<char,fmt::v10::detail::compile_parse_context<char>>;
        local_68 = local_c0.handler_;
        do {
          if (pcVar9 == "") break;
          pcVar8 = pcVar9;
          if (*pcVar9 == '{') {
LAB_00162ce3:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char>_>::
            writer::operator()((writer *)&local_c0,pcVar9,pcVar8);
            pcVar9 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char>&>
                               (pcVar8,"",(format_string_checker<char> *)local_88);
            bVar10 = true;
          }
          else {
            pcVar8 = pcVar9 + 1;
            bVar10 = pcVar8 != "";
            if (bVar10) {
              if (*pcVar8 != '{') {
                pcVar5 = pcVar9 + 2;
                do {
                  pcVar8 = pcVar5;
                  bVar10 = pcVar8 != "";
                  if (pcVar8 == "") goto LAB_00162cdf;
                  pcVar5 = pcVar8 + 1;
                } while (*pcVar8 != '{');
              }
              bVar10 = true;
            }
LAB_00162cdf:
            if (bVar10) goto LAB_00162ce3;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char>_>::
            writer::operator()((writer *)&local_c0,pcVar9,"");
            bVar10 = false;
          }
        } while (bVar10);
        local_88._0_8_ = local_90;
        fmt_00.size_ = 8;
        fmt_00.data_ = (char *)0x38;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)local_88;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_e0,(v10 *)"PSKd includes non-digit and non-uppercase characters: {}",
                   fmt_00,args_00);
        local_b8 = kInvalidArgs;
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,local_e0._M_dataplus._M_p,
                   local_e0._M_dataplus._M_p + local_e0._M_string_length);
        __return_storage_ptr__->mCode = local_b8;
        std::__cxx11::string::operator=((string *)this,(string *)local_b0);
        if (local_b0[0] != local_a0) {
LAB_00162c11:
          operator_delete(local_b0[0]);
        }
LAB_00162c16:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
        bVar4 = true;
        bVar10 = false;
      }
      if (!bVar10) goto LAB_00162f19;
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != local_38);
    bVar4 = true;
LAB_00162f19:
    if (bVar4) {
      return __return_storage_ptr__;
    }
    local_e0._M_dataplus._M_p = (this->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == paVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_88._0_8_ = 0x400000004;
    local_88._8_4_ = 4;
    pcVar9 = "PSKd length(={}) exceeds range [{}, {}]";
    local_78 = "PSKd length(={}) exceeds range [{}, {}]";
    local_70 = 0x27;
    local_68 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x300000000;
    local_58 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    pcStack_50 = ::fmt::v10::detail::
                 parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_48 = ::fmt::v10::detail::
               parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_c0.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_88;
    local_60[0] = (parse_func)local_88;
    do {
      if (pcVar9 == "") break;
      pcVar8 = pcVar9;
      if (*pcVar9 == '{') {
LAB_00162e45:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>_>
        ::writer::operator()(&local_c0,pcVar9,pcVar8);
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long,unsigned_long>&>
                           (pcVar8,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_88);
        bVar10 = true;
      }
      else {
        pcVar8 = pcVar9 + 1;
        bVar10 = pcVar8 != "";
        if (bVar10) {
          if (*pcVar8 != '{') {
            pcVar5 = pcVar9 + 2;
            do {
              pcVar8 = pcVar5;
              bVar10 = pcVar8 != "";
              if (pcVar8 == "") goto LAB_00162e41;
              pcVar5 = pcVar8 + 1;
            } while (*pcVar8 != '{');
          }
          bVar10 = true;
        }
LAB_00162e41:
        if (bVar10) goto LAB_00162e45;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long,_unsigned_long,_unsigned_long>_>
        ::writer::operator()(&local_c0,pcVar9,"");
        bVar10 = false;
      }
    } while (bVar10);
    local_88._0_8_ = aPSKd->_M_string_length;
    local_78 = (char *)0x6;
    local_68 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x20;
    fmt_01.size_ = 0x444;
    fmt_01.data_ = (char *)0x27;
    args_01.field_1.args_ = in_R9.args_;
    args_01.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_e0,(v10 *)"PSKd length(={}) exceeds range [{}, {}]",fmt_01,args_01);
    local_b8 = kInvalidArgs;
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b0,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    __return_storage_ptr__->mCode = local_b8;
    std::__cxx11::string::operator=((string *)this,(string *)local_b0);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_e0._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::ValidatePSKd(const std::string &aPSKd)
{
    Error error;

    VerifyOrExit(aPSKd.size() >= kMinJoinerDeviceCredentialLength && aPSKd.size() <= kMaxJoinerDeviceCredentialLength,
                 error = ERROR_INVALID_ARGS("PSKd length(={}) exceeds range [{}, {}]", aPSKd.size(),
                                            kMinJoinerDeviceCredentialLength, kMaxJoinerDeviceCredentialLength));

    for (auto c : aPSKd)
    {
        VerifyOrExit(isdigit(c) || isupper(c),
                     error = ERROR_INVALID_ARGS("PSKd includes non-digit and non-uppercase characters: {}", c));
        VerifyOrExit(c != 'I' && c != 'O' && c != 'Q' && c != 'Z',
                     error = ERROR_INVALID_ARGS("PSKd includes invalid uppercase characters: {}", c));
    }

exit:
    return error;
}